

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O3

void sat_solver2_setnvars(sat_solver2 *s,int n)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  veci *pvVar4;
  varinfo2 *pvVar5;
  int *piVar6;
  char *pcVar7;
  lit *plVar8;
  cla *pcVar9;
  uint *puVar10;
  int *__ptr;
  uint uVar11;
  long lVar12;
  size_t sVar13;
  uint uVar14;
  veci *pvVar15;
  ulong uVar16;
  
  iVar3 = s->cap;
  if (iVar3 < n) {
    iVar2 = iVar3;
    do {
      iVar2 = iVar2 * 2 + 1;
    } while (iVar2 < n);
    s->cap = iVar2;
    sVar13 = (long)(iVar2 * 2) << 4;
    if (s->wlists == (veci *)0x0) {
      pvVar4 = (veci *)malloc(sVar13);
    }
    else {
      pvVar4 = (veci *)realloc(s->wlists,sVar13);
    }
    s->wlists = pvVar4;
    sVar13 = (long)s->cap << 2;
    if (s->vi == (varinfo2 *)0x0) {
      pvVar5 = (varinfo2 *)malloc(sVar13);
    }
    else {
      pvVar5 = (varinfo2 *)realloc(s->vi,sVar13);
    }
    s->vi = pvVar5;
    sVar13 = (long)s->cap << 2;
    if (s->levels == (int *)0x0) {
      piVar6 = (int *)malloc(sVar13);
    }
    else {
      piVar6 = (int *)realloc(s->levels,sVar13);
    }
    s->levels = piVar6;
    if (s->assigns == (char *)0x0) {
      pcVar7 = (char *)malloc((long)s->cap);
    }
    else {
      pcVar7 = (char *)realloc(s->assigns,(long)s->cap);
    }
    s->assigns = pcVar7;
    sVar13 = (long)s->cap << 2;
    if (s->trail == (lit *)0x0) {
      plVar8 = (lit *)malloc(sVar13);
    }
    else {
      plVar8 = (lit *)realloc(s->trail,sVar13);
    }
    s->trail = plVar8;
    sVar13 = (long)s->cap << 2;
    if (s->orderpos == (int *)0x0) {
      piVar6 = (int *)malloc(sVar13);
    }
    else {
      piVar6 = (int *)realloc(s->orderpos,sVar13);
    }
    s->orderpos = piVar6;
    sVar13 = (long)s->cap << 2;
    if (s->reasons == (cla *)0x0) {
      pcVar9 = (cla *)malloc(sVar13);
    }
    else {
      pcVar9 = (cla *)realloc(s->reasons,sVar13);
    }
    s->reasons = pcVar9;
    if (s->fProofLogging != 0) {
      sVar13 = (long)s->cap << 2;
      if (s->units == (cla *)0x0) {
        pcVar9 = (cla *)malloc(sVar13);
      }
      else {
        pcVar9 = (cla *)realloc(s->units,sVar13);
      }
      s->units = pcVar9;
    }
    sVar13 = (long)s->cap << 2;
    if (s->activity == (uint *)0x0) {
      puVar10 = (uint *)malloc(sVar13);
    }
    else {
      puVar10 = (uint *)realloc(s->activity,sVar13);
    }
    s->activity = puVar10;
    sVar13 = (long)s->cap << 2;
    if (s->activity2 == (uint *)0x0) {
      puVar10 = (uint *)malloc(sVar13);
    }
    else {
      puVar10 = (uint *)realloc(s->activity2,sVar13);
    }
    s->activity2 = puVar10;
    iVar2 = s->cap;
    if (s->model == (int *)0x0) {
      piVar6 = (int *)malloc((long)iVar2 * 4);
    }
    else {
      piVar6 = (int *)realloc(s->model,(long)iVar2 * 4);
      iVar2 = s->cap;
    }
    s->model = piVar6;
    memset(s->wlists + (long)iVar3 * 2,0,(long)((iVar2 - iVar3) * 2) << 4);
  }
  iVar3 = s->size;
  if (iVar3 < n) {
    lVar12 = (long)iVar3;
    do {
      pvVar4 = s->wlists;
      if (pvVar4[lVar12 * 2].size != 0) {
        __assert_fail("!s->wlists[2*var].size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver2.c"
                      ,0x4ae,"void sat_solver2_setnvars(sat_solver2 *, int)");
      }
      uVar16 = lVar12 * 2 | 1;
      if (pvVar4[uVar16].size != 0) {
        __assert_fail("!s->wlists[2*var+1].size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver2.c"
                      ,0x4af,"void sat_solver2_setnvars(sat_solver2 *, int)");
      }
      pvVar15 = pvVar4 + lVar12 * 2;
      if (pvVar15->ptr == (int *)0x0) {
        pvVar15->cap = 4;
        pvVar15->size = 0;
        piVar6 = (int *)malloc(0x10);
        pvVar15->ptr = piVar6;
      }
      if (pvVar4[uVar16].ptr == (int *)0x0) {
        pvVar4 = pvVar4 + uVar16;
        pvVar4->cap = 4;
        pvVar4->size = 0;
        piVar6 = (int *)malloc(0x10);
        pvVar4->ptr = piVar6;
      }
      s->vi[lVar12] = (varinfo2)0x0;
      s->levels[lVar12] = 0;
      s->assigns[lVar12] = '\x03';
      s->reasons[lVar12] = 0;
      if (s->fProofLogging != 0) {
        s->units[lVar12] = 0;
      }
      s->activity[lVar12] = 0x400;
      s->model[lVar12] = 0;
      uVar11 = (s->order).size;
      piVar6 = s->orderpos;
      piVar6[lVar12] = uVar11;
      __ptr = (s->order).ptr;
      if (uVar11 == (s->order).cap) {
        iVar3 = (uVar11 >> 1) * 3;
        if ((int)uVar11 < 4) {
          iVar3 = uVar11 * 2;
        }
        if (__ptr == (int *)0x0) {
          __ptr = (int *)malloc((long)iVar3 << 2);
        }
        else {
          __ptr = (int *)realloc(__ptr,(long)iVar3 << 2);
        }
        (s->order).ptr = __ptr;
        if (__ptr == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)(s->order).cap * 9.5367431640625e-07,(double)iVar3 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->order).cap = iVar3;
        uVar11 = (s->order).size;
        piVar6 = s->orderpos;
      }
      (s->order).size = uVar11 + 1;
      __ptr[(int)uVar11] = (int)lVar12;
      uVar16 = (ulong)piVar6[lVar12];
      iVar3 = __ptr[uVar16];
      if (uVar16 == 0) {
        uVar11 = 0;
      }
      else {
        if (piVar6[lVar12] == -1) {
          __assert_fail("s->orderpos[v] != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver2.c"
                        ,0xf2,"void order_update(sat_solver2 *, int)");
        }
        puVar10 = s->activity;
        do {
          uVar1 = (uint)uVar16;
          uVar14 = (int)((uVar1 - ((int)(uVar1 - 1) >> 0x1f)) + -1) >> 1;
          iVar2 = __ptr[(int)uVar14];
          uVar11 = uVar1;
          if (puVar10[iVar3] <= puVar10[iVar2]) break;
          __ptr[(int)uVar1] = iVar2;
          piVar6[iVar2] = uVar1;
          uVar16 = (ulong)uVar14;
          uVar11 = uVar14;
        } while (2 < uVar1);
      }
      __ptr[(int)uVar11] = iVar3;
      piVar6[iVar3] = uVar11;
      lVar12 = lVar12 + 1;
    } while ((int)lVar12 != n);
    iVar3 = s->size;
  }
  if (n < iVar3) {
    n = iVar3;
  }
  s->size = n;
  return;
}

Assistant:

void sat_solver2_setnvars(sat_solver2* s,int n)
{
    int var;

    if (s->cap < n){
        int old_cap = s->cap;
        while (s->cap < n) s->cap = s->cap*2+1;

        s->wlists    = ABC_REALLOC(veci,     s->wlists,   s->cap*2);
        s->vi        = ABC_REALLOC(varinfo2, s->vi,       s->cap);
        s->levels    = ABC_REALLOC(int,      s->levels,   s->cap);
        s->assigns   = ABC_REALLOC(char,     s->assigns,  s->cap);
        s->trail     = ABC_REALLOC(lit,      s->trail,    s->cap);
        s->orderpos  = ABC_REALLOC(int,      s->orderpos, s->cap);
        s->reasons   = ABC_REALLOC(cla,      s->reasons,  s->cap);
        if ( s->fProofLogging )
        s->units     = ABC_REALLOC(cla,      s->units,    s->cap);
#ifdef USE_FLOAT_ACTIVITY2
        s->activity  = ABC_REALLOC(double,   s->activity, s->cap);
#else
        s->activity  = ABC_REALLOC(unsigned, s->activity, s->cap);
        s->activity2 = ABC_REALLOC(unsigned, s->activity2,s->cap);
#endif
        s->model     = ABC_REALLOC(int,      s->model,    s->cap);
        memset( s->wlists + 2*old_cap, 0, 2*(s->cap-old_cap)*sizeof(vecp) );
    }

    for (var = s->size; var < n; var++){
        assert(!s->wlists[2*var].size);
        assert(!s->wlists[2*var+1].size);
        if ( s->wlists[2*var].ptr == NULL )
            veci_new(&s->wlists[2*var]);
        if ( s->wlists[2*var+1].ptr == NULL )
            veci_new(&s->wlists[2*var+1]);
        *((int*)s->vi + var) = 0; //s->vi[var].val = varX;
        s->levels  [var] = 0;
        s->assigns [var] = varX;
        s->reasons [var] = 0;
        if ( s->fProofLogging )
        s->units   [var] = 0;
#ifdef USE_FLOAT_ACTIVITY2
        s->activity[var] = 0;
#else
        s->activity[var] = (1<<10);
#endif
        s->model   [var] = 0;
        // does not hold because variables enqueued at top level will not be reinserted in the heap
        // assert(veci_size(&s->order) == var); 
        s->orderpos[var] = veci_size(&s->order);
        veci_push(&s->order,var);
        order_update(s, var);
    }
    s->size = n > s->size ? n : s->size;
}